

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImTextStrToUtf8(char *out_buf,int out_buf_size,ImWchar *in_text,ImWchar *in_text_end)

{
  ushort uVar1;
  int iVar2;
  ushort *in_RCX;
  ushort *in_RDX;
  int in_ESI;
  char *in_RDI;
  bool bVar3;
  uint c;
  char *buf_end;
  char *buf_p;
  char *local_28;
  ushort *local_18;
  
  local_28 = in_RDI;
  local_18 = in_RDX;
  while( true ) {
    bVar3 = false;
    if ((local_28 < in_RDI + in_ESI + -1) &&
       ((in_RCX == (ushort *)0x0 || (bVar3 = false, local_18 < in_RCX)))) {
      bVar3 = *local_18 != 0;
    }
    if (!bVar3) break;
    uVar1 = *local_18;
    if (uVar1 < 0x80) {
      *local_28 = (char)uVar1;
      local_28 = local_28 + 1;
      local_18 = local_18 + 1;
    }
    else {
      iVar2 = ImTextCharToUtf8_inline
                        (local_28,((int)(in_RDI + in_ESI) - (int)local_28) + -1,(uint)uVar1);
      local_28 = local_28 + iVar2;
      local_18 = local_18 + 1;
    }
  }
  *local_28 = '\0';
  return (int)local_28 - (int)in_RDI;
}

Assistant:

int ImTextStrToUtf8(char* out_buf, int out_buf_size, const ImWchar* in_text, const ImWchar* in_text_end)
{
    char* buf_p = out_buf;
    const char* buf_end = out_buf + out_buf_size;
    while (buf_p < buf_end - 1 && (!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c = (unsigned int)(*in_text++);
        if (c < 0x80)
            *buf_p++ = (char)c;
        else
            buf_p += ImTextCharToUtf8_inline(buf_p, (int)(buf_end - buf_p - 1), c);
    }
    *buf_p = 0;
    return (int)(buf_p - out_buf);
}